

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Custom.cpp
# Opt level: O2

void __thiscall
Iir::Custom::TwoPole::setup
          (TwoPole *this,double scale,double poleRho,double poleTheta,double zeroRho,
          double zeroTheta)

{
  complex_t pole2;
  complex_t zero2;
  undefined8 in_RCX;
  undefined8 extraout_RDX;
  undefined8 in_RSI;
  undefined8 in_R8;
  double dVar1;
  double dVar2;
  undefined8 in_XMM1_Qb;
  complex_t pole1;
  complex_t zero1;
  
  cos(poleTheta);
  dVar1 = sin(poleTheta);
  dVar1 = poleRho * dVar1;
  dVar2 = cos(zeroTheta);
  dVar2 = dVar2 * zeroRho;
  sin(zeroTheta);
  pole2._M_value._8_8_ = zeroTheta;
  pole2._M_value._0_8_ = dVar2;
  zero2._M_value._8_8_ = in_XMM1_Qb;
  zero2._M_value._0_8_ = dVar1;
  pole1._M_value._8_8_ = extraout_RDX;
  pole1._M_value._0_8_ = in_RSI;
  zero1._M_value._8_8_ = in_R8;
  zero1._M_value._0_8_ = in_RCX;
  Biquad::setTwoPole(&this->super_Biquad,pole1,zero1,pole2,zero2);
  Biquad::applyScale(&this->super_Biquad,scale);
  return;
}

Assistant:

void TwoPole::setup (double scale,
                     double poleRho,
                     double poleTheta,
                     double zeroRho,
                     double zeroTheta)
{
  complex_t pole = std::polar (poleRho, poleTheta);
  complex_t zero = std::polar (zeroRho, zeroTheta);

  setTwoPole (pole, zero, std::conj(pole), std::conj(zero));
  applyScale (scale);
}